

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

WString * __thiscall
Jinx::Variant::GetWString_abi_cxx11_(WString *__return_storage_ptr__,Variant *this)

{
  String local_38;
  Variant *local_18;
  Variant *this_local;
  
  local_18 = this;
  this_local = (Variant *)__return_storage_ptr__;
  GetString_abi_cxx11_(&local_38,this);
  Impl::ConvertUtf8ToWString(__return_storage_ptr__,&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline WString Variant::GetWString() const
	{
		return Impl::ConvertUtf8ToWString(GetString());
	}